

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O0

shared_ptr<duckdb::ExternalDependency,_true> * __thiscall
duckdb::shared_ptr<duckdb::ExternalDependency,_true>::operator=
          (shared_ptr<duckdb::ExternalDependency,_true> *this,
          shared_ptr<duckdb::ExternalDependency,_true> *other)

{
  shared_ptr<duckdb::ExternalDependency,_true> *in_RSI;
  shared_ptr<duckdb::ExternalDependency,_true> *in_RDI;
  shared_ptr<duckdb::ExternalDependency,_true> *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    shared_ptr(in_RDI,in_stack_ffffffffffffffc8);
    swap(in_RDI,in_stack_ffffffffffffffc8);
    ~shared_ptr((shared_ptr<duckdb::ExternalDependency,_true> *)0x2463b5);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

shared_ptr<T> &operator=(const shared_ptr &other) noexcept {
		if (this == &other) {
			return *this;
		}
		// Create a new shared_ptr using the copy constructor, then swap out the ownership to *this
		shared_ptr(other).swap(*this);
		return *this;
	}